

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryDatumSpecification.cpp
# Opt level: O0

void __thiscall
DIS::DataQueryDatumSpecification::marshal(DataQueryDatumSpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_58 [8];
  UnsignedDISInteger x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  UnsignedDISInteger x;
  size_t idx;
  DataStream *dataStream_local;
  DataQueryDatumSpecification *this_local;
  
  sVar2 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                    (&this->_fixedDatumIDList);
  DataStream::operator<<(dataStream,(uint)sVar2);
  sVar2 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                    (&this->_variableDatumIDList);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._val = 0;
  x._12_4_ = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                      (&this->_fixedDatumIDList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::
             operator[](&this->_fixedDatumIDList,x._8_8_);
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_30,pvVar3);
    UnsignedDISInteger::marshal((UnsignedDISInteger *)local_30,dataStream);
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._val = 0;
  x_1._12_4_ = 0;
  while( true ) {
    uVar1 = x_1._8_8_;
    sVar2 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::size
                      (&this->_variableDatumIDList);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::UnsignedDISInteger,_std::allocator<DIS::UnsignedDISInteger>_>::
             operator[](&this->_variableDatumIDList,x_1._8_8_);
    UnsignedDISInteger::UnsignedDISInteger((UnsignedDISInteger *)local_58,pvVar3);
    UnsignedDISInteger::marshal((UnsignedDISInteger *)local_58,dataStream);
    UnsignedDISInteger::~UnsignedDISInteger((UnsignedDISInteger *)local_58);
    x_1._8_8_ = x_1._8_8_ + 1;
  }
  return;
}

Assistant:

void DataQueryDatumSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_fixedDatumIDList.size();
    dataStream << ( unsigned int )_variableDatumIDList.size();

     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _fixedDatumIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        UnsignedDISInteger x = _variableDatumIDList[idx];
        x.marshal(dataStream);
     }

}